

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::CreateFromPoints(ON_Plane *this,ON_3dPoint *P,ON_3dPoint *Q,ON_3dPoint *R)

{
  bool bVar1;
  ON_3dVector local_60;
  ON_3dVector local_48;
  byte local_29;
  ON_3dPoint *pOStack_28;
  bool rc;
  ON_3dPoint *R_local;
  ON_3dPoint *Q_local;
  ON_3dPoint *P_local;
  ON_Plane *this_local;
  
  (this->origin).x = P->x;
  (this->origin).y = P->y;
  (this->origin).z = P->z;
  pOStack_28 = R;
  R_local = Q;
  Q_local = P;
  P_local = &this->origin;
  local_29 = ON_3dVector::PerpendicularTo(&this->zaxis,P,Q,R);
  ON_3dPoint::operator-(&local_48,R_local,Q_local);
  (this->xaxis).x = local_48.x;
  (this->xaxis).y = local_48.y;
  (this->xaxis).z = local_48.z;
  ON_3dVector::Unitize(&this->xaxis);
  ON_CrossProduct(&local_60,&this->zaxis,&this->xaxis);
  (this->yaxis).x = local_60.x;
  (this->yaxis).y = local_60.y;
  (this->yaxis).z = local_60.z;
  ON_3dVector::Unitize(&this->yaxis);
  bVar1 = ON_PlaneEquation::Create(&this->plane_equation,this->origin,this->zaxis);
  if (!bVar1) {
    local_29 = 0;
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool ON_Plane::CreateFromPoints(
          const ON_3dPoint& P,  // point on the plane
          const ON_3dPoint& Q,  // point on the plane
          const ON_3dPoint& R   // point on the plane
          )
{
  origin = P;
  bool rc = zaxis.PerpendicularTo(P,Q,R);
  xaxis = Q - P;
  xaxis.Unitize();
  yaxis = ON_CrossProduct( zaxis, xaxis );
  yaxis.Unitize();

  if ( !plane_equation.Create(origin,zaxis) )
    rc = false;

  return rc;
}